

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Variable __thiscall LiteScript::String::GetMember(String *this,Memory *memory,char *name)

{
  int iVar1;
  size_type sVar2;
  Object *this_00;
  Number *this_01;
  char *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Number local_34;
  undefined1 local_29;
  char *name_local;
  Memory *memory_local;
  String *this_local;
  Variable *result;
  uint *puVar3;
  
  name_local = name;
  memory_local = memory;
  this_local = this;
  iVar1 = strcmp(in_RCX,"length");
  if (iVar1 == 0) {
    local_29 = 0;
    Memory::Create((Memory *)this,(Type *)name_local);
    sVar2 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)memory);
    Number::Number(&local_34,(int)sVar2);
    this_00 = Variable::operator->((Variable *)this);
    this_01 = Object::GetData<LiteScript::Number>(this_00);
    Number::operator=(this_01,&local_34);
    puVar3 = extraout_RDX;
  }
  else {
    VVar4 = Memory::Create((Memory *)this,(Type *)name_local);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::String::GetMember(LiteScript::Memory& memory, const char * name) {
    if (strcmp(name, "length") == 0) {
        Variable result = memory.Create(Type::NUMBER);
        result->GetData<Number>() = Number((int)this->str.size());
        return result;
    }
    else {
        return memory.Create(_type_undefined);
    }
}